

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall
slang::ast::Scope::handleNestedDefinition(Scope *this,ModuleDeclarationSyntax *syntax)

{
  SyntaxKind SVar1;
  ModuleHeaderSyntax *pMVar2;
  ParameterPortListSyntax *pPVar3;
  PortListSyntax *pPVar4;
  DefinitionSymbol *pDVar5;
  Symbol *member;
  
  pMVar2 = (syntax->header).ptr;
  pPVar3 = pMVar2->parameters;
  if (((pPVar3 == (ParameterPortListSyntax *)0x0) ||
      ((pPVar3->declarations).elements._M_extent._M_extent_value == 0)) &&
     ((pPVar4 = pMVar2->ports, pPVar4 == (PortListSyntax *)0x0 ||
      (((SVar1 = (pPVar4->super_SyntaxNode).kind, SVar1 == NonAnsiPortList ||
        (SVar1 == AnsiPortList)) && (pPVar4[3].super_SyntaxNode.previewNode == (SyntaxNode *)0x0))))
     )) {
    pDVar5 = Compilation::getDefinition(this->compilation,this,syntax);
    if ((pDVar5 != (DefinitionSymbol *)0x0) && (pDVar5->instanceCount == 0)) {
      member = InstanceSymbol::createDefaultNested(this,syntax);
      insertMember(this,member,this->lastMember,true,true);
      return;
    }
  }
  return;
}

Assistant:

void Scope::handleNestedDefinition(const ModuleDeclarationSyntax& syntax) const {
    // We implicitly instantiate this definition if it has no parameters
    // and no ports and hasn't been instantiated elsewhere.
    auto& header = *syntax.header;
    if (header.parameters && !header.parameters->declarations.empty())
        return;

    if (header.ports) {
        if (header.ports->kind == SyntaxKind::AnsiPortList) {
            if (!header.ports->as<AnsiPortListSyntax>().ports.empty())
                return;
        }
        else if (header.ports->kind == SyntaxKind::NonAnsiPortList) {
            if (!header.ports->as<NonAnsiPortListSyntax>().ports.empty())
                return;
        }
        else {
            return;
        }
    }

    auto def = compilation.getDefinition(*this, syntax);
    if (!def || def->getInstanceCount() > 0)
        return;

    auto& inst = InstanceSymbol::createDefaultNested(*this, syntax);
    insertMember(&inst, lastMember, /* isElaborating */ true, /* incrementIndex */ true);
}